

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cc
# Opt level: O0

int absl::GetStackFrames(void **result,int *sizes,int max_depth,int skip_count)

{
  int iVar1;
  __pointer_type p_Var2;
  int skip_count_local;
  int max_depth_local;
  int *sizes_local;
  void **result_local;
  int size;
  Unwinder g;
  Unwinder f;
  
  g = UnwindImpl<true,false>;
  p_Var2 = std::atomic<int_(*)(void_**,_int_*,_int,_int,_const_void_*,_int_*)>::load
                     ((atomic<int_(*)(void_**,_int_*,_int,_int,_const_void_*,_int_*)> *)
                      &(anonymous_namespace)::custom,acquire);
  if (p_Var2 != (__pointer_type)0x0) {
    g = p_Var2;
  }
  iVar1 = (*g)(result,sizes,max_depth,skip_count + 1,(void *)0x0,(int *)0x0);
  return iVar1;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE ABSL_ATTRIBUTE_NO_TAIL_CALL int GetStackFrames(
    void** result, int* sizes, int max_depth, int skip_count) {
  return Unwind<true, false>(result, sizes, max_depth, skip_count, nullptr,
                             nullptr);
}